

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,duckdb::uhugeint_t>
          (TryCast *this,string_t input,uhugeint_t *result,bool strict)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  idx_t pos;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uint64_t *puVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  idx_t iVar17;
  long lVar18;
  bool bVar19;
  ExponentData exponent;
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> state;
  IntegerCastData<short> local_be;
  undefined4 local_bc;
  ulong local_b8;
  uint64_t *local_b0;
  ulong local_a8;
  ulong local_a0;
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> local_98;
  undefined8 local_40;
  long local_38;
  
  puVar11 = input.value._8_8_;
  local_38 = input.value._0_8_;
  local_98.result.lower = 0;
  local_98.result.upper = 0;
  uVar15 = (ulong)this & 0xffffffff;
  if (uVar15 != 0) {
    lVar18 = input.value._0_8_;
    if ((uint)this < 0xd) {
      lVar18 = (long)&local_40 + 4;
    }
    uVar16 = 0;
    do {
      bVar4 = *(byte *)(lVar18 + uVar16);
      if ((4 < bVar4 - 9) && (bVar4 != 0x20)) {
        local_98.decimal_intermediate.upper = 0;
        local_98.decimal_intermediate_digits = 0;
        local_98._74_6_ = 0;
        local_98.decimal_total_digits = 0;
        local_98._50_6_ = 0;
        local_98.decimal_intermediate.lower = 0;
        local_98.decimal.lower = 0;
        local_98.decimal.upper = 0;
        local_98.intermediate = 0;
        local_98.digits = '\0';
        local_98._25_7_ = 0;
        local_98.result.lower = 0;
        local_98.result.upper = 0;
        local_b8 = uVar15 - uVar16;
        local_bc = SUB84(result,0);
        local_b0 = puVar11;
        local_40 = this;
        if (bVar4 == 0x2d) {
          uVar6 = 1;
          bVar3 = false;
          goto LAB_00d77682;
        }
        if ((uVar15 - 1 != uVar16) && (bVar4 == 0x30)) {
          bVar1 = *(byte *)(lVar18 + 1 + uVar16);
          if (bVar1 < 0x62) {
            if ((bVar1 == 0x42) || (bVar1 == 0x58)) {
LAB_00d7778b:
              if (0xfffffffffffffffd < (uVar15 - uVar16) - 3) {
                HugeIntegerCastOperation::
                Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                          (&local_98);
              }
              break;
            }
          }
          else if ((bVar1 == 0x62) || (bVar1 == 0x78)) goto LAB_00d7778b;
          if (((byte)(bVar1 - 0x30) < 10 & (byte)result) != 0) break;
        }
        if ((bVar4 == 0x2b & (byte)result) == 0) {
          local_a8 = (ulong)(bVar4 == 0x2b);
          uVar6 = local_a8;
          goto LAB_00d778ab;
        }
        break;
      }
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  goto LAB_00d77c63;
  while (lVar10 = lVar18 + uVar6, uVar6 = uVar6 + 1, *(char *)(uVar16 + lVar10) == '0') {
LAB_00d77682:
    if (local_b8 <= uVar6) {
      uVar6 = 1;
      goto LAB_00d776dd;
    }
  }
  goto LAB_00d77c66;
  while( true ) {
    cVar2 = *(char *)(uVar16 + lVar18 + uVar6);
    bVar4 = cVar2 - 0x30;
    if (9 < bVar4) {
      if (cVar2 != '.') goto LAB_00d77a18;
      puVar11 = local_b0;
      if ((char)local_bc != '\0') goto LAB_00d77c63;
      uVar12 = uVar6 + 1;
      iVar8 = 3;
      uVar9 = uVar12;
      if (local_b8 <= uVar12) goto LAB_00d77bc6;
      goto LAB_00d777d8;
    }
    uVar12 = uVar6 + 1;
    bVar3 = HugeIntegerCastOperation::
            HandleDigit<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                      (&local_98,bVar4);
    if (bVar3) {
      bVar19 = true;
      if ((~uVar6 + uVar15 != uVar16) &&
         (bVar19 = true, *(char *)(uVar16 + 1 + lVar18 + uVar6) == '_' && (char)local_bc == '\0')) {
        uVar12 = uVar6 + 2;
        if ((uVar15 - uVar6) - 2 == uVar16) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(*(char *)(uVar16 + lVar18 + uVar12) - 0x30U) < 10;
        }
      }
    }
    else {
      bVar19 = false;
    }
    bVar3 = false;
    puVar11 = local_b0;
    uVar6 = uVar12;
    if (!bVar19) break;
LAB_00d776dd:
    if (local_b8 <= uVar6) goto LAB_00d77bea;
  }
  goto LAB_00d77c66;
  while( true ) {
    uVar14 = uVar9 + 1;
    if ((~uVar9 + uVar15 != uVar16) && (*(char *)(uVar16 + 1 + uVar9 + lVar18) == '_')) {
      lVar10 = uVar15 - uVar9;
      uVar14 = uVar9 + 2;
      iVar5 = 1;
      uVar9 = uVar14;
      if ((lVar10 - 2U == uVar16) || (9 < (byte)(*(char *)(uVar16 + lVar18 + uVar14) - 0x30U)))
      goto LAB_00d77bd8;
    }
    uVar9 = uVar14;
    uVar12 = local_a8;
    if (local_b8 <= uVar14) break;
LAB_00d777d8:
    local_a8 = uVar12;
    bVar4 = *(char *)(uVar16 + uVar9 + lVar18) - 0x30;
    if (9 < bVar4) {
      iVar8 = 0;
      uVar12 = local_a8;
      goto LAB_00d77bc6;
    }
    bVar3 = HugeIntegerCastOperation::
            HandleDecimal<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true,true>
                      (&local_98,bVar4);
    if (!bVar3) {
      iVar5 = 1;
      goto LAB_00d77bd8;
    }
  }
  iVar8 = 3;
LAB_00d77bc6:
  iVar5 = 1;
  if (uVar12 < uVar9) {
    iVar5 = iVar8;
  }
  if (1 < uVar6) {
    iVar5 = iVar8;
  }
LAB_00d77bd8:
  uVar6 = uVar9;
  if (iVar5 != 3) {
    puVar11 = local_b0;
    if (iVar5 != 0) goto LAB_00d77c63;
LAB_00d77a18:
    puVar11 = local_b0;
    bVar4 = *(byte *)(uVar16 + lVar18 + uVar6);
    bVar3 = false;
    uVar7 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (4 < uVar7 - 9) goto LAB_00d77c66;
    }
    else {
      if ((bVar4 == 0x65) || (uVar7 == 0x45)) {
        if ((uVar6 != 1 && (char)local_bc == '\0') && (uVar6 + 1 < local_b8)) {
          local_be.result = 0;
          pcVar13 = (char *)(uVar16 + lVar18 + uVar6 + 1);
          iVar17 = ~uVar16 + (uVar15 - uVar6);
          if (*pcVar13 == '-') {
            bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar13,iVar17,&local_be,false);
          }
          else {
            bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar13,iVar17,&local_be,false);
          }
          bVar3 = false;
          if (bVar19 != false) {
            bVar3 = HugeIntegerCastOperation::
                    HandleExponent<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                              (&local_98,(int)local_be.result);
          }
          goto LAB_00d77c66;
        }
        goto LAB_00d77c63;
      }
      if (uVar7 != 0x20) goto LAB_00d77c66;
    }
    uVar15 = uVar6 + 1;
    uVar6 = uVar15;
    if (uVar15 < local_b8) {
      do {
        bVar4 = *(byte *)(uVar16 + lVar18 + uVar15);
        if ((4 < bVar4 - 9) && (bVar4 != 0x20)) goto LAB_00d77c63;
        uVar15 = uVar15 + 1;
        uVar6 = local_b8;
      } while (local_b8 != uVar15);
    }
  }
LAB_00d77bea:
  puVar11 = local_b0;
  bVar3 = HugeIntegerCastOperation::
          Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                    (&local_98);
  if (bVar3) {
    bVar3 = 1 < uVar6;
    goto LAB_00d77c66;
  }
  goto LAB_00d77c63;
  while( true ) {
    cVar2 = *(char *)(uVar16 + lVar18 + uVar6);
    bVar4 = cVar2 - 0x30;
    if (9 < bVar4) {
      if (cVar2 != '.') goto LAB_00d77a6d;
      puVar11 = local_b0;
      if ((char)local_bc != '\0') goto LAB_00d77c63;
      uVar12 = uVar6 + 1;
      iVar8 = 3;
      uVar9 = uVar12;
      if (local_b8 <= uVar12) goto LAB_00d77c22;
      goto LAB_00d77970;
    }
    uVar12 = uVar6 + 1;
    bVar3 = HugeIntegerCastOperation::
            HandleDigit<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                      (&local_98,bVar4);
    if (bVar3) {
      bVar19 = true;
      if ((~uVar6 + uVar15 != uVar16) &&
         (bVar19 = true, *(char *)(uVar16 + 1 + lVar18 + uVar6) == '_' && (char)local_bc == '\0')) {
        uVar12 = uVar6 + 2;
        if ((uVar15 - uVar6) - 2 == uVar16) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(*(char *)(uVar16 + lVar18 + uVar12) - 0x30U) < 10;
        }
      }
    }
    else {
      bVar19 = false;
    }
    bVar3 = false;
    puVar11 = local_b0;
    uVar6 = uVar12;
    if (!bVar19) break;
LAB_00d778ab:
    if (local_b8 <= uVar6) goto LAB_00d77c47;
  }
  goto LAB_00d77c66;
  while( true ) {
    uVar14 = uVar9 + 1;
    if ((~uVar9 + uVar15 != uVar16) && (*(char *)(uVar16 + 1 + uVar9 + lVar18) == '_')) {
      lVar10 = uVar15 - uVar9;
      uVar14 = uVar9 + 2;
      iVar5 = 1;
      uVar9 = uVar14;
      if ((lVar10 - 2U == uVar16) || (9 < (byte)(*(char *)(uVar16 + lVar18 + uVar14) - 0x30U)))
      goto LAB_00d77c35;
    }
    uVar9 = uVar14;
    uVar12 = local_a0;
    if (local_b8 <= uVar14) break;
LAB_00d77970:
    local_a0 = uVar12;
    bVar4 = *(char *)(uVar16 + uVar9 + lVar18) - 0x30;
    if (9 < bVar4) {
      iVar8 = 0;
      uVar12 = local_a0;
      goto LAB_00d77c22;
    }
    bVar3 = HugeIntegerCastOperation::
            HandleDecimal<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false,true>
                      (&local_98,bVar4);
    if (!bVar3) {
      iVar5 = 1;
      goto LAB_00d77c35;
    }
  }
  iVar8 = 3;
LAB_00d77c22:
  iVar5 = 1;
  if (uVar12 < uVar9) {
    iVar5 = iVar8;
  }
  if (local_a8 < uVar6) {
    iVar5 = iVar8;
  }
LAB_00d77c35:
  uVar6 = uVar9;
  if (iVar5 != 3) {
    puVar11 = local_b0;
    if (iVar5 != 0) goto LAB_00d77c63;
LAB_00d77a6d:
    puVar11 = local_b0;
    bVar4 = *(byte *)(uVar16 + lVar18 + uVar6);
    bVar3 = false;
    uVar7 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (4 < uVar7 - 9) goto LAB_00d77c66;
    }
    else {
      if ((bVar4 == 0x65) || (uVar7 == 0x45)) {
        if ((uVar6 != local_a8 && (char)local_bc == '\0') && (uVar6 + 1 < local_b8)) {
          local_be.result = 0;
          pcVar13 = (char *)(uVar16 + lVar18 + uVar6 + 1);
          iVar17 = ~uVar16 + (uVar15 - uVar6);
          if (*pcVar13 == '-') {
            bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar13,iVar17,&local_be,false);
          }
          else {
            bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar13,iVar17,&local_be,false);
          }
          bVar3 = false;
          if (bVar19 != false) {
            bVar3 = HugeIntegerCastOperation::
                    HandleExponent<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                              (&local_98,(int)local_be.result);
          }
          goto LAB_00d77c66;
        }
        goto LAB_00d77c63;
      }
      if (uVar7 != 0x20) goto LAB_00d77c66;
    }
    uVar15 = uVar6 + 1;
    uVar6 = uVar15;
    if (uVar15 < local_b8) {
      do {
        bVar4 = *(byte *)(uVar16 + lVar18 + uVar15);
        if ((4 < bVar4 - 9) && (bVar4 != 0x20)) goto LAB_00d77c63;
        uVar15 = uVar15 + 1;
        uVar6 = local_b8;
      } while (local_b8 != uVar15);
    }
  }
LAB_00d77c47:
  uVar15 = local_a8;
  puVar11 = local_b0;
  bVar3 = HugeIntegerCastOperation::
          Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                    (&local_98);
  if (bVar3) {
    bVar3 = uVar15 < uVar6;
    goto LAB_00d77c66;
  }
LAB_00d77c63:
  bVar3 = false;
LAB_00d77c66:
  if (bVar3 != false) {
    *puVar11 = local_98.result.lower;
    puVar11[1] = local_98.result.upper;
  }
  return bVar3;
}

Assistant:

bool TryCast::Operation(string_t input, uhugeint_t &result, bool strict) {
	HugeIntCastData<uhugeint_t, Uhugeint, uint64_t> state {};
	if (!TryIntegerCast<HugeIntCastData<uhugeint_t, Uhugeint, uint64_t>, false, true, HugeIntegerCastOperation>(
	        input.GetData(), input.GetSize(), state, strict)) {
		return false;
	}
	result = state.result;
	return true;
}